

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O2

void __thiscall mp::SPAdapter::ExtractRandomTerms(SPAdapter *this)

{
  SparseMatrix<double> *this_00;
  int *piVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int *piVar5;
  ColProblem *pCVar6;
  pointer pRVar7;
  pointer piVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  pointer pdVar12;
  pointer pBVar13;
  Expr e;
  ulong uVar14;
  ulong uVar15;
  pointer pRVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  size_type __n;
  long lVar22;
  long lVar23;
  reference rVar24;
  VariableCollector collector;
  SparseMatrix<double_*> var2con;
  VariableCollector local_e0;
  SparseMatrix<double_*> local_78;
  
  piVar5 = (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar22 = (long)*piVar5;
  uVar4 = piVar5[1];
  this_00 = &this->linear_random_;
  SparseMatrix<double>::resize_major(this_00,uVar4);
  pCVar6 = this->problem_;
  pRVar7 = (this->random_vars_).
           super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar16 = (this->random_vars_).
                 super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pRVar16 != pRVar7; pRVar16 = pRVar16 + 1
      ) {
    piVar8 = (pCVar6->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar17 = piVar8[(long)pRVar16->var_index + 1];
    piVar9 = (this->linear_random_).starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar21 = (long)piVar8[pRVar16->var_index]; iVar17 != lVar21; lVar21 = lVar21 + 1) {
      piVar5 = piVar9 + (piVar10[(pCVar6->row_indices_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar21]] - lVar22) + 1;
      *piVar5 = *piVar5 + 1;
    }
  }
  piVar8 = (this_00->starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = 0;
  uVar18 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar18 = uVar15;
  }
  iVar17 = 0;
  for (; uVar18 != uVar15; uVar15 = uVar15 + 1) {
    iVar20 = piVar8[uVar15 + 1];
    piVar8[uVar15 + 1] = iVar17;
    iVar17 = iVar20 + iVar17;
  }
  SparseMatrix<double>::resize_elements(this_00,iVar17);
  pCVar6 = this->problem_;
  pRVar7 = (this->random_vars_).
           super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar16 = (this->random_vars_).
                 super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pRVar16 != pRVar7; pRVar16 = pRVar16 + 1
      ) {
    piVar8 = (pCVar6->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar17 = piVar8[(long)pRVar16->var_index + 1];
    piVar9 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = (this->linear_random_).starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar11 = (this->linear_random_).indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = (this->linear_random_).values_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (lVar21 = (long)piVar8[pRVar16->var_index]; iVar17 != lVar21; lVar21 = lVar21 + 1) {
      lVar23 = piVar9[(pCVar6->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar21]] - lVar22;
      iVar20 = piVar10[lVar23 + 1];
      piVar10[lVar23 + 1] = iVar20 + 1;
      piVar11[iVar20] = pRVar16->var_index;
      pdVar12[iVar20] =
           -(pCVar6->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar21];
    }
  }
  local_e0.super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
  super_RandomConstExprExtractor<mp::(anonymous_namespace)::VariableCollector>.scenario_ = 0;
  local_e0.super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
  super_RandomConstExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
  super_ExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double>.
  super_BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
  ._vptr_BasicExprVisitor =
       (BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
        )&PTR__BasicRandomAffineExprExtractor_00188798;
  local_e0.super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
  super_RandomConstExprExtractor<mp::(anonymous_namespace)::VariableCollector>.sp_ = this;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_e0.
              super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
              temp_coefs_,
             (long)(int)((ulong)((long)(this->var_core2orig_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->var_core2orig_).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2),
             (allocator_type *)&local_78);
  local_e0.super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>.coef_
       = 1.0;
  local_e0.super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
  super_RandomConstExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
  super_ExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double>.
  super_BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
  ._vptr_BasicExprVisitor =
       (BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
        )&PTR__VariableCollector_00188708;
  local_e0.vars_in_nonlinear_ = &this->vars_in_nonlinear_;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_e0.visited_vars_,
             (long)(int)((ulong)((long)(this->var_core2orig_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->var_core2orig_).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2),
             (allocator_type *)&local_78);
  pdVar12 = (this->problem_->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar5 = ((local_e0.
             super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
             super_RandomConstExprExtractor<mp::(anonymous_namespace)::VariableCollector>.sp_)->
           num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar17 = *piVar5;
  uVar4 = piVar5[1];
  SparseMatrix<double>::resize_major(local_e0.vars_in_nonlinear_,uVar4);
  uVar15 = 0;
  uVar18 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar18 = uVar15;
  }
  while (uVar15 != uVar18) {
    uVar14 = (ulong)((local_e0.
                      super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>
                      .super_RandomConstExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
                     sp_)->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15 + (long)iVar17];
    pBVar13 = ((local_e0.
                super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
                super_RandomConstExprExtractor<mp::(anonymous_namespace)::VariableCollector>.sp_)->
               problem_->super_Problem).nonlinear_cons_.
              super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar14 < (ulong)((long)((local_e0.
                                  super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>
                                  .
                                  super_RandomConstExprExtractor<mp::(anonymous_namespace)::VariableCollector>
                                 .sp_)->problem_->super_Problem).nonlinear_cons_.
                                super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar13 >> 3)) &&
       (e.super_ExprBase.impl_ = (ExprBase)pBVar13[uVar14].super_ExprBase.impl_,
       e.super_ExprBase.impl_ != (Impl *)0x0)) {
      BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
      ::Visit((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
               *)&local_e0,e);
    }
    iVar20 = (int)((ulong)((long)((local_e0.vars_in_nonlinear_)->indices_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)((local_e0.vars_in_nonlinear_)->indices_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    ((local_e0.vars_in_nonlinear_)->starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar15 + 1] = iVar20;
    SparseMatrix<double>::resize_elements(local_e0.vars_in_nonlinear_,iVar20);
    piVar8 = ((local_e0.vars_in_nonlinear_)->starts_).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar5 = piVar8 + uVar15;
    uVar15 = uVar15 + 1;
    iVar20 = piVar8[uVar15];
    for (lVar21 = (long)*piVar5; lVar21 < iVar20; lVar21 = lVar21 + 1) {
      __n = (size_type)
            ((local_e0.vars_in_nonlinear_)->indices_).super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar21];
      ((local_e0.vars_in_nonlinear_)->values_).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar21] =
           local_e0.
           super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
           temp_coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[__n];
      local_e0.super_BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>.
      temp_coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[__n] = 0.0;
      rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[](&local_e0.visited_vars_,__n);
      *rVar24._M_p = *rVar24._M_p & ~rVar24._M_mask;
    }
  }
  uVar18 = (ulong)((long)(this->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start) >> 2;
  local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar17 = (int)uVar18;
  internal::Transpose(&this->vars_in_nonlinear_,&local_78,iVar17);
  pCVar6 = this->problem_;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->core_coefs_,pdVar12,
             pdVar12 + (pCVar6->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [(int)((ulong)((long)(pCVar6->super_Problem).vars_.
                                            super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pCVar6->super_Problem).vars_.
                                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4)]);
  pCVar6 = this->problem_;
  piVar8 = (this->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = 0;
  uVar18 = uVar18 & 0xffffffff;
  if (iVar17 < 1) {
    uVar18 = uVar15;
  }
  while (uVar15 != uVar18) {
    piVar5 = piVar8 + uVar15;
    piVar1 = local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + uVar15;
    iVar17 = local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15 + 1];
    uVar15 = uVar15 + 1;
    pdVar12 = (this->core_coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar9 = (this->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar20 = (pCVar6->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[*piVar5];
    for (lVar21 = (long)*piVar1; lVar21 < iVar17; lVar21 = lVar21 + 1) {
      lVar23 = 0;
      do {
        lVar19 = lVar23;
        lVar23 = lVar19 + 1;
      } while ((pCVar6->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar20 + lVar19] !=
               piVar9[local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar21] + lVar22]);
      dVar2 = pdVar12[iVar20 + lVar19];
      dVar3 = *local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar21];
      *local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
       super__Vector_impl_data._M_start[lVar21] = dVar2;
      pdVar12[iVar20 + lVar19] = dVar3 + dVar2;
      iVar20 = iVar20 + (int)(lVar19 + 1) + -1;
    }
  }
  SparseMatrix<double_*>::~SparseMatrix(&local_78);
  anon_unknown_19::VariableCollector::~VariableCollector(&local_e0);
  return;
}

Assistant:

void SPAdapter::ExtractRandomTerms() {
  int num_stage1_cons = num_stage_cons_[0];
  int num_stage2_cons = num_stage_cons_[1];

  // A matrix containing linear terms involving random variables.
  // The major dimension is equal to the number of second-stage constraints.
  linear_random_.resize_major(num_stage2_cons);

  // Count random variables in second-stage constraints.
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i) {
    for (int k = problem_.col_start(i->var_index),
         end = problem_.col_start(i->var_index + 1); k != end; ++k) {
       int core_con_index = con_orig2core_[problem_.row_index(k)];
       assert(core_con_index >= num_stage1_cons);
       ++linear_random_.start(core_con_index - num_stage1_cons + 1);
    }
  }
  // Acummulate counts to get vector starts.
  int start = 0;
  for (int i = 1; i <= num_stage2_cons; ++i) {
    int next = start + linear_random_.start(i);
    linear_random_.start(i) = start;
    start = next;
  }

  // Map second-stage constraints to random variables that appear linearly
  // in them.
  linear_random_.resize_elements(start);
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i) {
    for (int k = problem_.col_start(i->var_index),
         end = problem_.col_start(i->var_index + 1); k != end; ++k) {
       int core_con_index = con_orig2core_[problem_.row_index(k)];
       assert(core_con_index >= num_stage1_cons);
       int index = core_con_index - num_stage1_cons + 1;
       int element_index = linear_random_.start(index)++;
       linear_random_.index(element_index) = i->var_index;
       linear_random_.value(element_index) = -problem_.value(k);
    }
  }

  // Get variables that appear in nonlinear parts of constraint expressions.
  VariableCollector collector(*this, vars_in_nonlinear_);
  const double *coefs = problem_.values();
  collector.Collect();

  // Convert vars_in_nonlinear_ to column-major form.
  int num_vars = this->num_vars();
  SparseMatrix<double*> var2con;
  internal::Transpose(vars_in_nonlinear_, var2con, num_vars);

  // Combine the first scenario with core coefficients.
  core_coefs_.assign(coefs, coefs + problem_.col_start(problem_.num_vars()));
  for (int core_var_index = 0; core_var_index < num_vars; ++core_var_index) {
    int var_index = var_core2orig_[core_var_index];
    int elt_index = problem_.col_start(var_index);
    for (int j = var2con.start(core_var_index),
         n = var2con.start(core_var_index + 1); j < n; ++j) {
      int con_index = con_core2orig_[var2con.index(j) + num_stage1_cons];
      while (problem_.row_index(elt_index) != con_index)
        ++elt_index;
      assert(elt_index < problem_.col_start(var_index + 1));
      double coef = core_coefs_[elt_index] + *var2con.value(j);
      *var2con.value(j) = core_coefs_[elt_index];
      core_coefs_[elt_index] = coef;
    }
  }
}